

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_translatev3(matrix4 *self,vector3 *translation)

{
  matrix4 translationMatrix;
  anon_union_128_5_d0a4420b_for_matrix4_0 local_88;
  
  local_88.m[0] = 1.0;
  local_88.m[1] = 0.0;
  local_88.m[2] = 0.0;
  local_88.m[4] = 0.0;
  local_88.m[5] = 1.0;
  local_88.m[6] = 0.0;
  local_88.m[8] = 0.0;
  local_88.m[9] = 0.0;
  local_88.m[10] = 1.0;
  local_88.m[0xc] = 0.0;
  local_88.m[0xd] = 0.0;
  local_88.m[0xe] = 0.0;
  local_88.m[0xf] = 1.0;
  local_88.m[3] = (translation->field_0).v[0];
  local_88.m[7] = (translation->field_0).v[1];
  local_88.m[0xb] = (translation->field_0).v[2];
  matrix4_multiply(self,(matrix4 *)&local_88.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_translatev3(struct matrix4 *self, const struct vector3 *translation)
{
	struct matrix4 translationMatrix;

	return matrix4_multiply(self,
		matrix4_make_transformation_translationv3(&translationMatrix, translation));
}